

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud.cc
# Opt level: O1

void __thiscall
draco::PointCloud::SetAttribute
          (PointCloud *this,int att_id,
          unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *pa)

{
  iterator __position;
  __uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> _Var1;
  pointer puVar2;
  __uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> __ptr;
  long lVar3;
  uint32_t local_1c;
  
  local_1c = att_id;
  if ((int)((ulong)((long)(this->attributes_).
                          super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->attributes_).
                         super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3) <= att_id) {
    std::
    vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
    ::resize(&this->attributes_,(long)(att_id + 1));
  }
  lVar3 = (long)(((pa->_M_t).
                  super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                  .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl)->
                super_GeometryAttribute).attribute_type_;
  if (lVar3 < 5) {
    __position._M_current =
         this->named_attribute_index_[lVar3].super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        this->named_attribute_index_[lVar3].super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)(this->named_attribute_index_ + lVar3),
                 __position,(int *)&local_1c);
    }
    else {
      *__position._M_current = local_1c;
      this->named_attribute_index_[lVar3].super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  _Var1._M_t.
  super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>.
  super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
       (tuple<draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>)
       (pa->_M_t).
       super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>.
       _M_t.
       super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>.
       super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl;
  lVar3 = (long)(int)local_1c;
  *(uint32_t *)
   &((GeometryAttribute *)
    ((long)_Var1._M_t.
           super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
           .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl + 0x3c))->buffer_ =
       local_1c;
  puVar2 = (this->attributes_).
           super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (pa->_M_t).
  super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>._M_t.
  super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>.
  super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl = (PointAttribute *)0x0;
  __ptr._M_t.
  super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>.
  super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
       puVar2[lVar3]._M_t.
       super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>.
       _M_t;
  puVar2[lVar3]._M_t.
  super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>._M_t =
       _Var1._M_t.
       super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>.
       super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl;
  if ((_Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>)
      __ptr._M_t.
      super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>.
      super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl != (PointAttribute *)0x0) {
    std::default_delete<draco::PointAttribute>::operator()
              ((default_delete<draco::PointAttribute> *)(puVar2 + lVar3),
               (PointAttribute *)
               __ptr._M_t.
               super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
               .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

void PointCloud::SetAttribute(int att_id, std::unique_ptr<PointAttribute> pa) {
  DRACO_DCHECK(att_id >= 0);
  if (static_cast<int>(attributes_.size()) <= att_id) {
    attributes_.resize(att_id + 1);
  }
  if (pa->attribute_type() < GeometryAttribute::NAMED_ATTRIBUTES_COUNT) {
    named_attribute_index_[pa->attribute_type()].push_back(att_id);
  }
  pa->set_unique_id(att_id);
  attributes_[att_id] = std::move(pa);
}